

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O0

string * anon_unknown.dwarf_7f4f::generate_content
                   (string *__return_storage_ptr__,Output *output,char *path)

{
  allocator local_4b1;
  string local_4b0 [32];
  string local_490;
  allocator local_469;
  string local_468 [32];
  string local_448;
  allocator local_421;
  string local_420 [32];
  string local_400;
  allocator local_3d9;
  string local_3d8 [32];
  string local_3b8;
  allocator local_391;
  string local_390 [32];
  string local_370;
  allocator local_349;
  string local_348 [32];
  string local_328;
  allocator local_301;
  string local_300 [32];
  string local_2e0;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298;
  allocator local_271;
  string local_270 [32];
  string local_250;
  allocator local_229;
  string local_228 [32];
  string local_208;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0;
  allocator local_199;
  string local_198 [32];
  string local_178;
  allocator local_151;
  string local_150 [32];
  string local_130;
  allocator local_109;
  string local_108 [32];
  string local_e8;
  allocator local_c1;
  string local_c0 [32];
  string local_a0;
  allocator local_69;
  string local_68 [32];
  string local_48;
  undefined1 local_21;
  char *local_20;
  char *path_local;
  Output *output_local;
  string *text;
  
  local_21 = 0;
  local_20 = path;
  path_local = (char *)output;
  output_local = (Output *)__return_storage_ptr__;
  read_file(__return_storage_ptr__,path);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"@API_NAME@",&local_69);
  wire::string::replace(&local_48,__return_storage_ptr__,(string *)local_68,(string *)path_local);
  wire::string::operator=(__return_storage_ptr__,&local_48);
  wire::string::~string(&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"@TYPE_TYPEDEFS@",&local_c1);
  wire::string::replace
            (&local_a0,__return_storage_ptr__,(string *)local_c0,(string *)(path_local + 0x20));
  wire::string::operator=(__return_storage_ptr__,&local_a0);
  wire::string::~string(&local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"@ENUM_DEFINITIONS@",&local_109);
  wire::string::replace
            (&local_e8,__return_storage_ptr__,(string *)local_108,(string *)(path_local + 0x40));
  wire::string::operator=(__return_storage_ptr__,&local_e8);
  wire::string::~string(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"@EXT_MACROS@",&local_151);
  wire::string::replace
            (&local_130,__return_storage_ptr__,(string *)local_150,(string *)(path_local + 0x60));
  wire::string::operator=(__return_storage_ptr__,&local_130);
  wire::string::~string(&local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"@VER_MACROS@",&local_199);
  wire::string::replace
            (&local_178,__return_storage_ptr__,(string *)local_198,(string *)(path_local + 0x80));
  wire::string::operator=(__return_storage_ptr__,&local_178);
  wire::string::~string(&local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"@EXT_DECLARATIONS@",&local_1e1);
  wire::string::replace
            (&local_1c0,__return_storage_ptr__,(string *)local_1e0,(string *)(path_local + 0xa0));
  wire::string::operator=(__return_storage_ptr__,&local_1c0);
  wire::string::~string(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"@VER_DECLARATIONS@",&local_229);
  wire::string::replace
            (&local_208,__return_storage_ptr__,(string *)local_228,(string *)(path_local + 0xc0));
  wire::string::operator=(__return_storage_ptr__,&local_208);
  wire::string::~string(&local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"@EXT_DEFINITIONS@",&local_271);
  wire::string::replace
            (&local_250,__return_storage_ptr__,(string *)local_270,(string *)(path_local + 0xe0));
  wire::string::operator=(__return_storage_ptr__,&local_250);
  wire::string::~string(&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"@VER_DEFINITIONS@",&local_2b9);
  wire::string::replace
            (&local_298,__return_storage_ptr__,(string *)local_2b8,(string *)(path_local + 0x100));
  wire::string::operator=(__return_storage_ptr__,&local_298);
  wire::string::~string(&local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"@VER_LOADERS@",&local_301);
  wire::string::replace
            (&local_2e0,__return_storage_ptr__,(string *)local_300,(string *)(path_local + 0x120));
  wire::string::operator=(__return_storage_ptr__,&local_2e0);
  wire::string::~string(&local_2e0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"@EXT_LOADERS@",&local_349);
  wire::string::replace
            (&local_328,__return_storage_ptr__,(string *)local_348,(string *)(path_local + 0x140));
  wire::string::operator=(__return_storage_ptr__,&local_328);
  wire::string::~string(&local_328);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"@CMD_TYPEDEFS@",&local_391);
  wire::string::replace
            (&local_370,__return_storage_ptr__,(string *)local_390,(string *)(path_local + 0x160));
  wire::string::operator=(__return_storage_ptr__,&local_370);
  wire::string::~string(&local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"@CMD_DECLARATIONS@",&local_3d9);
  wire::string::replace
            (&local_3b8,__return_storage_ptr__,(string *)local_3d8,(string *)(path_local + 0x180));
  wire::string::operator=(__return_storage_ptr__,&local_3b8);
  wire::string::~string(&local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"@CMD_MACROS@",&local_421);
  wire::string::replace
            (&local_400,__return_storage_ptr__,(string *)local_420,(string *)(path_local + 0x1a0));
  wire::string::operator=(__return_storage_ptr__,&local_400);
  wire::string::~string(&local_400);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"@CMD_DEFINITIONS@",&local_469);
  wire::string::replace
            (&local_448,__return_storage_ptr__,(string *)local_468,(string *)(path_local + 0x1c0));
  wire::string::operator=(__return_storage_ptr__,&local_448);
  wire::string::~string(&local_448);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"@CMD_LOADERS@",&local_4b1);
  wire::string::replace
            (&local_490,__return_storage_ptr__,(string *)local_4b0,(string *)(path_local + 0x1e0));
  wire::string::operator=(__return_storage_ptr__,&local_490);
  wire::string::~string(&local_490);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  return __return_storage_ptr__;
}

Assistant:

wire::string generate_content(const Output& output, const char* path)
{
  wire::string text = read_file(path);

  text = text.replace("@API_NAME@", output.api_name);
  text = text.replace("@TYPE_TYPEDEFS@", output.type_typedefs);
  text = text.replace("@ENUM_DEFINITIONS@", output.enum_definitions);
  text = text.replace("@EXT_MACROS@", output.ext_macros);
  text = text.replace("@VER_MACROS@", output.ver_macros);
  text = text.replace("@EXT_DECLARATIONS@", output.ext_declarations);
  text = text.replace("@VER_DECLARATIONS@", output.ver_declarations);
  text = text.replace("@EXT_DEFINITIONS@", output.ext_definitions);
  text = text.replace("@VER_DEFINITIONS@", output.ver_definitions);
  text = text.replace("@VER_LOADERS@", output.ver_loaders);
  text = text.replace("@EXT_LOADERS@", output.ext_loaders);
  text = text.replace("@CMD_TYPEDEFS@", output.cmd_typedefs);
  text = text.replace("@CMD_DECLARATIONS@", output.cmd_declarations);
  text = text.replace("@CMD_MACROS@", output.cmd_macros);
  text = text.replace("@CMD_DEFINITIONS@", output.cmd_definitions);
  text = text.replace("@CMD_LOADERS@", output.cmd_loaders);

  return text;
}